

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QShape.cpp
# Opt level: O3

void __thiscall QShape::QShape(QShape *this,Shape shape,QWidget *parent)

{
  QShapePrivate *this_00;
  
  QFrame::QFrame(&this->super_QFrame,parent,0);
  *(undefined ***)this = &PTR_metaObject_001a6520;
  *(undefined ***)&this->field_0x10 = &PTR__QShape_001a66d8;
  this_00 = (QShapePrivate *)operator_new(0x60);
  QShapePrivate::QShapePrivate(this_00,this);
  this->d = this_00;
  if (this_00->shape != shape) {
    this_00->shape = shape;
    QShapePrivate::updateShape(this_00);
  }
  return;
}

Assistant:

QShape::QShape(QShape::Shape shape, QWidget *parent)
    : QFrame(parent)
    , d(new QShapePrivate(this)) {
    setShape(shape);
}